

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O3

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  KalmanFilter *this_00;
  VectorXd *pVVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  MatrixXd *__ptr;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar6;
  DenseIndex DVar7;
  ulong uVar8;
  double dVar9;
  DenseIndex DVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar11;
  long lVar12;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar13;
  ostream *poVar14;
  char *__function;
  float fVar15;
  float fVar16;
  Tools tools;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_e8;
  double local_c0;
  Tools local_b8;
  double local_b0;
  Scalar local_a8;
  double local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  
  if (this->is_initialized_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EKF: ",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_e8,4,4,1);
    pVVar1 = &(this->ekf_).x_;
    pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_e8.m_row;
    local_e8.m_xpr = pMVar6;
    local_e8.m_row = DVar7;
    free(pMVar6);
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = 1.0;
    local_b8._vptr_Tools = (_func_int **)0x3ff0000000000000;
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,
                         (Scalar *)&local_b8);
    local_a8 = 1.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar13,&local_a8);
    local_98 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar13,&local_98);
    if ((local_e8.m_currentBlockRows + local_e8.m_row !=
         ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows) || (local_e8.m_col != 1)) {
LAB_001047b5:
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001047ca;
    }
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_e8.m_row = 0;
    local_e8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
    pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    DVar10 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e8.m_row;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_e8.m_col;
    local_e8.m_xpr = pMVar6;
    local_e8.m_row = DVar7;
    local_e8.m_col = DVar10;
    free(pMVar6);
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_e8.m_row = 0;
    local_e8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
    pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    DVar10 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e8.m_row;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_e8.m_col;
    local_e8.m_xpr = pMVar6;
    local_e8.m_row = DVar7;
    local_e8.m_col = DVar10;
    free(pMVar6);
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_e8.m_row = 0;
    local_e8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
    pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    DVar10 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e8.m_row;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_e8.m_col;
    local_e8.m_xpr = pMVar6;
    local_e8.m_row = DVar7;
    local_e8.m_col = DVar10;
    free(pMVar6);
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    local_b8._vptr_Tools = (_func_int **)0x0;
    local_e8.m_xpr = &(this->ekf_).F_;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (&local_e8,(Scalar *)&local_b8);
    local_a8 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_a8);
    local_98 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_98);
    local_38 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_38);
    local_40 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_40);
    local_48 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_48);
    local_50 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_50);
    local_58 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_58);
    local_60 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_60);
    local_68 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_68);
    local_70 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_70);
    local_78 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_78);
    local_80 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_80);
    local_88 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_88);
    local_90 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar11,&local_90)
    ;
    lVar12 = ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_cols;
    if (local_e8.m_currentBlockRows + local_e8.m_row !=
        ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) {
      if (lVar12 != 0) goto LAB_0010477f;
      lVar12 = 0;
    }
    if (local_e8.m_col == lVar12) {
      local_e8.m_xpr = &(this->ekf_).P_;
      local_e8.m_row = 0;
      local_e8.m_col = 1;
      local_e8.m_currentBlockRows = 1;
      *((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_data = 1.0;
      local_b8._vptr_Tools = (_func_int **)0x0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (&local_e8,(Scalar *)&local_b8);
      local_a8 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_a8);
      local_98 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_98);
      local_38 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_38);
      local_40 = 1.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_40);
      local_48 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_48);
      local_50 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_50);
      local_58 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_58);
      local_60 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_60);
      local_68 = 1000.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_68);
      local_70 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_70);
      local_78 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_78);
      local_80 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_80);
      local_88 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_88);
      local_90 = 1000.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar11,&local_90);
      lVar12 = ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_cols;
      if (local_e8.m_currentBlockRows + local_e8.m_row !=
          ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows) {
        if (lVar12 != 0) goto LAB_0010477f;
        lVar12 = 0;
      }
      if (local_e8.m_col == lVar12) {
        if (measurement_pack->sensor_type_ == LASER) {
          lVar12 = (measurement_pack->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (lVar12 < 1) {
LAB_001047f3:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xad,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          pdVar5 = (measurement_pack->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_e8.m_row = 0;
          local_e8.m_col = 1;
          local_e8.m_currentBlockRows = 1;
          *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               = *pdVar5;
          local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
          if (lVar12 == 1) goto LAB_001047f3;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                               &local_e8,pdVar5 + 1);
          local_b8._vptr_Tools = (_func_int **)0x0;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              (pCVar13,(Scalar *)&local_b8);
          local_a8 = 0.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                    (pCVar13,&local_a8);
        }
        else {
          if (measurement_pack->sensor_type_ != RADAR) goto LAB_0010475c;
          uVar8 = (measurement_pack->raw_measurements_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if ((((long)uVar8 < 1) || (uVar8 == 1)) || (uVar8 < 3)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x9c,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          pdVar5 = (measurement_pack->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_b0 = *pdVar5;
          local_c0 = pdVar5[1];
          local_a0 = pdVar5[2];
          dVar9 = cos(local_c0);
          local_e8.m_row = 0;
          local_e8.m_col = 1;
          local_e8.m_currentBlockRows = 1;
          *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               = dVar9 * local_b0;
          local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
          dVar9 = sin(local_c0);
          local_b8._vptr_Tools = (_func_int **)(dVar9 * local_b0);
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                               &local_e8,(Scalar *)&local_b8);
          local_a8 = cos(local_c0);
          local_a8 = local_a8 * local_a0;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              (pCVar13,&local_a8);
          local_98 = sin(local_c0);
          local_98 = local_a0 * local_98;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                    (pCVar13,&local_98);
        }
        if ((local_e8.m_currentBlockRows + local_e8.m_row ==
             ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_rows) && (local_e8.m_col == 1)) {
LAB_0010475c:
          this->previous_timestamp_ = measurement_pack->timestamp_;
          this->is_initialized_ = true;
          return;
        }
        goto LAB_001047b5;
      }
    }
  }
  else {
    lVar12 = measurement_pack->timestamp_;
    lVar2 = this->previous_timestamp_;
    this->previous_timestamp_ = lVar12;
    lVar3 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    if ((lVar3 < 1) ||
       (lVar4 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols, lVar4 < 3)) {
LAB_00104796:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x151,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    fVar16 = (float)((double)(lVar12 - lVar2) / 1000000.0);
    pdVar5 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    pdVar5[lVar3 * 2] = (double)fVar16;
    if ((lVar3 == 1) || (lVar4 == 3)) goto LAB_00104796;
    local_b0 = (double)CONCAT44(local_b0._4_4_,fVar16 * fVar16);
    fVar15 = fVar16 * fVar16 * fVar16;
    pdVar5[lVar3 * 3 + 1] = (double)fVar16;
    local_e8.m_xpr = &(this->ekf_).Q_;
    fVar16 = fVar16 * fVar15 * 0.25;
    local_a0 = (double)CONCAT44(local_a0._4_4_,fVar16);
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = (double)(this->noise_ax * fVar16);
    local_b8._vptr_Tools = (_func_int **)0x0;
    local_c0._0_4_ = fVar15;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (&local_e8,(Scalar *)&local_b8);
    local_c0._0_4_ = local_c0._0_4_ * 0.5;
    local_a8 = (Scalar)(this->noise_ax * local_c0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_a8);
    local_98 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_98);
    local_38 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_38);
    local_40 = (Scalar)(local_a0._0_4_ * this->noise_ay);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_40);
    local_48 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_48);
    local_50 = (Scalar)(this->noise_ay * local_c0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_50);
    local_58 = (Scalar)(this->noise_ax * local_c0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_58);
    local_60 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_60);
    local_68 = (Scalar)(this->noise_ax * local_b0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_68);
    local_70 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_70);
    local_78 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_78);
    local_80 = (Scalar)(local_c0._0_4_ * this->noise_ay);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_80);
    local_88 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_88);
    local_90 = (Scalar)(local_b0._0_4_ * this->noise_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar11,&local_90)
    ;
    lVar12 = ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_cols;
    if (local_e8.m_currentBlockRows + local_e8.m_row !=
        ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) {
      if (lVar12 != 0) goto LAB_0010477f;
      lVar12 = 0;
    }
    if (local_e8.m_col == lVar12) {
      this_00 = &this->ekf_;
      KalmanFilter::Predict(this_00);
      if (measurement_pack->sensor_type_ == RADAR) {
        Tools::Tools(&local_b8);
        Tools::CalculateJacobian((MatrixXd *)&local_e8,&local_b8,&(this->ekf_).x_);
        __ptr = (MatrixXd *)
                (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
        (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)local_e8.m_xpr;
        DVar7 = (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
        DVar10 = (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols;
        (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows = local_e8.m_row;
        (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = local_e8.m_col;
        local_e8.m_xpr = __ptr;
        local_e8.m_row = DVar7;
        local_e8.m_col = DVar10;
        free(__ptr);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_);
        KalmanFilter::UpdateEKF(this_00,&measurement_pack->raw_measurements_);
        Tools::~Tools(&local_b8);
      }
      else {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_);
        KalmanFilter::Update(this_00,&measurement_pack->raw_measurements_);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x_ = ",5);
      poVar14 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                  &(this->ekf_).x_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_ = ",5);
      poVar14 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  &(this->ekf_).P_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      return;
    }
  }
LAB_0010477f:
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_001047ca:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,__function);
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {

  /*****************************************************************************
   *  Initialization
   ****************************************************************************/

  if (!is_initialized_) {

    // Initialize the state ekf_.x_
    cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);
    ekf_.x_ << 1, 1, 1, 1;

    // prediction covariance matrix
    ekf_.P_ = MatrixXd(4, 4);
    ekf_.F_ = MatrixXd(4, 4);
    ekf_.Q_ = MatrixXd(4, 4);

    // initialize transition matrix
    ekf_.F_ << 1, 0, 1, 0,
              0, 1, 0, 1,
              0, 0, 1, 0,
              0, 0, 0, 1;

    // initialize prediction covariance matrix
    ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;
    
    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      
      // convert radar measurements from polar to cartesian
      // Set state ekf_.x_ to the first measurement.
      double ro = measurement_pack.raw_measurements_[0];
      double phi = measurement_pack.raw_measurements_[1];
      double ro_dot = measurement_pack.raw_measurements_[2];

      ekf_.x_ << ro * cos(phi), ro * sin(phi), ro_dot * cos(phi), ro_dot * sin(phi);
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      // Set state ekf_.x_ to the first measurement.
      ekf_.x_ << measurement_pack.raw_measurements_(0), measurement_pack.raw_measurements_(1), 0.0, 0.0;
    }

    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  //compute the time elapsed between the current and previous measurements
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;	//dt - expressed in seconds
  previous_timestamp_ = measurement_pack.timestamp_;

  float dt_2 = dt * dt;
  float dt_3 = dt_2 * dt;
  float dt_4 = dt_3 * dt;

  // update F matrix
  ekf_.F_(0, 2) = dt;
  ekf_.F_(1, 3) = dt;

  // Update the process covariance matrix Q
  // noise_ax = 9 and noise_ay = 9
  ekf_.Q_ << dt_4 / 4 * noise_ax, 0, dt_3 / 2 * noise_ax, 0,
    0, dt_4 / 4 * noise_ay, 0, dt_3 / 2 * noise_ay,
    dt_3 / 2 * noise_ax, 0, dt_2*noise_ax, 0,
    0, dt_3 / 2 * noise_ay, 0, dt_2*noise_ay;
  
  // predict
  
  //if (fabs(dt) > 0.001) {
  //  ekf_.Predict();
  //}
  ekf_.Predict();
  

  /*****************************************************************************
   *  Update: the state and covariance matrices.
   ****************************************************************************/

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    
    // Radar updates
    Tools tools;
    ekf_.H_ = tools.CalculateJacobian(ekf_.x_);
    ekf_.R_ = R_radar_;
    ekf_.UpdateEKF(measurement_pack.raw_measurements_);
    
  } else {

    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }

  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}